

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.h
# Opt level: O0

int __thiscall basisu::gpu_image::init(gpu_image *this,EVP_PKEY_CTX *ctx)

{
  uint32_t uVar1;
  int extraout_EAX;
  uint32_t in_ECX;
  uint32_t in_EDX;
  texture_format tVar2;
  undefined4 in_stack_ffffffffffffffe8;
  
  tVar2 = (texture_format)ctx;
  this->m_fmt = tVar2;
  this->m_width = in_EDX;
  this->m_height = in_ECX;
  uVar1 = get_block_width(this->m_fmt);
  this->m_block_width = uVar1;
  uVar1 = get_block_height(this->m_fmt);
  this->m_block_height = uVar1;
  this->m_blocks_x = ((this->m_width + this->m_block_width) - 1) / this->m_block_width;
  this->m_blocks_y = ((this->m_height + this->m_block_height) - 1) / this->m_block_height;
  uVar1 = basisu::get_qwords_per_block(cETC1);
  this->m_qwords_per_block = uVar1;
  vector<unsigned_long>::resize
            ((vector<unsigned_long> *)CONCAT44(tVar2,in_EDX),
             CONCAT44(in_ECX,in_stack_ffffffffffffffe8),SUB81((ulong)this >> 0x38,0));
  vector<unsigned_long>::resize
            ((vector<unsigned_long> *)CONCAT44(tVar2,in_EDX),
             CONCAT44(in_ECX,in_stack_ffffffffffffffe8),SUB81((ulong)this >> 0x38,0));
  return extraout_EAX;
}

Assistant:

void init(texture_format fmt, uint32_t width, uint32_t height)
		{
			m_fmt = fmt;
			m_width = width;
			m_height = height;
			m_block_width = basisu::get_block_width(m_fmt);
			m_block_height = basisu::get_block_height(m_fmt);
			m_blocks_x = (m_width + m_block_width - 1) / m_block_width;
			m_blocks_y = (m_height + m_block_height - 1) / m_block_height;
			m_qwords_per_block = basisu::get_qwords_per_block(m_fmt);

			m_blocks.resize(0);
			m_blocks.resize(m_blocks_x * m_blocks_y * m_qwords_per_block);
		}